

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O1

set<int,_std::less<int>,_std::allocator<int>_> *
getWallTags(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
           ImportedUgrid *mesh)

{
  _Rb_tree_color _Var1;
  _Rb_tree_node_base *p_Var2;
  vector<int,_std::allocator<int>_> all_tags;
  vector<int,_std::allocator<int>_> local_48;
  
  findAllTags(&local_48,mesh);
  tellUserTags(&local_48);
  getUserTags();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Measuring distance to nearest tag: ",0x23);
  for (p_Var2 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    _Var1 = p_Var2[1]._M_color;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::ostream::operator<<((ostream *)&std::cout,_Var1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<int> getWallTags(const Parfait::ImportedUgrid& mesh){
    auto all_tags = findAllTags(mesh);
    tellUserTags(all_tags);
    auto tags = getUserTags();
    std::cout << "Measuring distance to nearest tag: ";
    for(auto t : tags){
        std::cout << " " << t;
    }
    std::cout << std::endl;
    return tags;
}